

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O0

void __thiscall
mini_bus::
NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reset(NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  exception_ptr local_20;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mtx);
  std::
  optional<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reset(&this->value);
  std::__exception_ptr::exception_ptr::exception_ptr(&local_20,(nullptr_t)0x0);
  std::__exception_ptr::exception_ptr::operator=(&this->ex,&local_20);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_20);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

inline void reset() {
    std::lock_guard lock{mtx};
    value.reset();
    ex = nullptr;
  }